

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::
FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<604U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<605U,_Fixpp::Type::String>,_Fixpp::TagT<606U,_Fixpp::Type::String>_>_>_>
::Visitor::Visitor(Visitor *this,ParsingContext *context,GroupSet *groupSet,bool strict,
                  bool skipUnknown)

{
  bool skipUnknown_local;
  bool strict_local;
  GroupSet *groupSet_local;
  ParsingContext *context_local;
  Visitor *this_local;
  
  this->recursive = false;
  this->context = context;
  this->groupSet = groupSet;
  this->strict = strict;
  this->skipUnknown = skipUnknown;
  return;
}

Assistant:

Visitor(ParsingContext& context, GroupSet& groupSet, bool strict, bool skipUnknown)
                    : recursive(false)
                    , context(context)
                    , groupSet(groupSet)
                    , strict(strict)
                    , skipUnknown(skipUnknown)
                    
                { }